

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

int fits_quantize_float(long row,float *fdata,long nxpix,long nypix,int nullcheck,
                       float in_null_value,float qlevel,int dither_method,int *idata,double *bscale,
                       double *bzero,int *iminval,int *imaxval)

{
  float fVar1;
  long lVar2;
  uint uVar3;
  float *pfVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  double dVar19;
  float minval;
  float maxval;
  float local_84;
  double local_80;
  long ngood;
  double local_70;
  float local_68;
  double noise5;
  double noise3;
  double noise2;
  int status;
  
  ngood = 0;
  iVar6 = 0;
  minval = 0.0;
  maxval = 0.0;
  lVar13 = nypix * nxpix;
  if (lVar13 < 2) {
    dVar16 = 0.0;
    local_80 = 1.0;
LAB_001f6cf2:
    *bscale = local_80;
    *bzero = dVar16;
  }
  else {
    local_84 = in_null_value;
    if (0.0 <= qlevel) {
      local_80 = (double)CONCAT44(local_80._4_4_,dither_method);
      local_70 = (double)qlevel;
      local_68 = qlevel;
      FnNoise5_float(fdata,nxpix,nypix,nullcheck,in_null_value,&ngood,&minval,&maxval,&noise2,
                     &noise3,&noise5,&status);
      if ((nullcheck == 0) || (ngood != 0)) {
        if (noise3 <= noise2 || noise2 == 0.0) {
          noise2 = noise3;
        }
        if (((noise5 != 0.0) || (NAN(noise5))) && (noise5 < noise2)) {
          noise2 = noise5;
        }
      }
      else {
        minval = 0.0;
        maxval = 1.0;
        noise2 = 1.0;
      }
      dVar16 = noise2 / local_70;
      if ((local_68 == 0.0) && (!NAN(local_68))) {
        dVar16 = noise2 * 0.25;
      }
      dither_method = local_80._0_4_;
      if ((dVar16 != 0.0) || (NAN(dVar16))) goto LAB_001f68b2;
    }
    else {
      lVar5 = 1;
      lVar7 = nypix;
      if (nxpix < 5) {
        lVar7 = 1;
        lVar5 = nypix;
      }
      dVar16 = (double)-qlevel;
      lVar2 = lVar5 * nxpix;
      if (lVar2 < 5) {
        if (lVar2 < 1) {
          maxval = -3.4028235e+38;
          minval = 3.4028235e+38;
          ngood = 0;
        }
        else {
          minval = 3.4028235e+38;
          maxval = -3.4028235e+38;
          ngood = 0;
          lVar7 = 0;
          do {
            if (nullcheck == 0) {
LAB_001f6546:
              fVar18 = fdata[lVar7];
              fVar1 = fVar18;
              if (minval <= fVar18) {
                fVar1 = minval;
              }
              minval = fVar1;
              if (fVar18 <= maxval) {
                fVar18 = maxval;
              }
              maxval = fVar18;
              ngood = ngood + 1;
            }
            else if ((fdata[lVar7] != in_null_value) || (NAN(fdata[lVar7]) || NAN(in_null_value)))
            goto LAB_001f6546;
            lVar7 = lVar7 + 1;
          } while (lVar2 - lVar7 != 0);
        }
      }
      else if (lVar7 < 1) {
        maxval = -3.4028235e+38;
        minval = 3.4028235e+38;
        ngood = 0;
      }
      else {
        minval = 3.4028235e+38;
        maxval = -3.4028235e+38;
        ngood = 0;
        lVar8 = 0;
        pfVar4 = fdata;
        do {
          lVar10 = 0;
          lVar11 = lVar10;
          if (nullcheck != 0) {
            do {
              lVar11 = lVar10;
              if ((pfVar4[lVar10] != in_null_value) || (NAN(pfVar4[lVar10]) || NAN(in_null_value)))
              break;
              lVar10 = lVar10 + 1;
              lVar11 = lVar2;
            } while (lVar2 - lVar10 != 0);
          }
          if (lVar11 != lVar2) {
            lVar10 = lVar11 + 1;
            lVar9 = lVar10;
            if ((nullcheck != 0) && (lVar10 < lVar2)) {
              while (lVar9 = lVar10, pfVar4[lVar10] == in_null_value) {
                if ((NAN(pfVar4[lVar10]) || NAN(in_null_value)) ||
                   (lVar10 = lVar10 + 1, lVar9 = lVar2, lVar2 - lVar10 == 0)) break;
              }
            }
            lVar10 = lVar8 * lVar2;
            fVar18 = fdata[lVar10 + lVar11];
            fVar1 = fVar18;
            if (minval <= fVar18) {
              fVar1 = minval;
            }
            minval = fVar1;
            if (fVar18 <= maxval) {
              fVar18 = maxval;
            }
            maxval = fVar18;
            if (lVar9 != lVar2) {
              lVar11 = lVar9 + 1;
              lVar12 = lVar11;
              if ((nullcheck != 0) && (lVar11 < lVar2)) {
                while (lVar12 = lVar11, pfVar4[lVar11] == in_null_value) {
                  if ((NAN(pfVar4[lVar11]) || NAN(in_null_value)) ||
                     (lVar11 = lVar11 + 1, lVar12 = lVar2, lVar2 - lVar11 == 0)) break;
                }
              }
              maxval = fdata[lVar10 + lVar9];
              fVar1 = maxval;
              if (minval <= maxval) {
                fVar1 = minval;
              }
              minval = fVar1;
              if (maxval <= fVar18) {
                maxval = fVar18;
              }
              if (lVar12 != lVar2) {
                lVar11 = lVar12 + 1;
                lVar9 = lVar11;
                if ((nullcheck != 0) && (lVar11 < lVar2)) {
                  while (lVar9 = lVar11, pfVar4[lVar11] == in_null_value) {
                    if ((NAN(pfVar4[lVar11]) || NAN(in_null_value)) ||
                       (lVar11 = lVar11 + 1, lVar9 = lVar2, lVar2 - lVar11 == 0)) break;
                  }
                }
                fVar18 = fdata[lVar10 + lVar12];
                fVar1 = fVar18;
                if (minval <= fVar18) {
                  fVar1 = minval;
                }
                minval = fVar1;
                if (fVar18 <= maxval) {
                  fVar18 = maxval;
                }
                maxval = fVar18;
                if (lVar9 != lVar2) {
                  fVar1 = fdata[lVar10 + lVar9];
                  fVar17 = fVar1;
                  if (minval <= fVar1) {
                    fVar17 = minval;
                  }
                  minval = fVar17;
                  if (fVar1 <= fVar18) {
                    fVar1 = fVar18;
                  }
                  while (lVar11 = lVar9 + 1, lVar11 < lVar2) {
                    lVar9 = lVar11;
                    if ((nullcheck != 0) && (lVar11 < lVar2)) {
                      while (lVar9 = lVar11, pfVar4[lVar11] == in_null_value) {
                        if ((NAN(pfVar4[lVar11]) || NAN(in_null_value)) ||
                           (lVar11 = lVar11 + 1, lVar9 = lVar2, lVar2 - lVar11 == 0)) break;
                      }
                    }
                    if (lVar9 == lVar2) break;
                    fVar18 = fdata[lVar10 + lVar9];
                    fVar17 = fVar18;
                    if (minval <= fVar18) {
                      fVar17 = minval;
                    }
                    if (fVar18 <= fVar1) {
                      fVar18 = fVar1;
                    }
                    ngood = ngood + 1;
                    minval = fVar17;
                    fVar1 = fVar18;
                  }
                  ngood = ngood + 4;
                  maxval = 0.0;
                }
              }
            }
          }
          lVar8 = lVar8 + 1;
          pfVar4 = pfVar4 + lVar5 * nxpix;
        } while (lVar8 != lVar7);
      }
LAB_001f68b2:
      local_80 = dVar16;
      if ((double)(maxval - minval) / local_80 <= 4294967284.0) {
        if (row < 1) {
          uVar15 = 0;
          iVar6 = 0;
        }
        else {
          if ((fits_rand_value == (float *)0x0) && (iVar6 = fits_init_randoms(), iVar6 != 0)) {
            return 0x71;
          }
          uVar15 = (ulong)(uint)((int)(row - 1U) + (int)((row - 1U) / 10000) * -10000);
          iVar6 = (int)(fits_rand_value[uVar15] * 500.0);
        }
        pfVar4 = fits_rand_value;
        if (ngood == lVar13) {
          if (dither_method == 2) {
            dVar16 = local_80 * 2147483637.0 + (double)minval;
          }
          else if (2147483637.0 <= (double)(maxval - minval) / local_80) {
            dVar16 = (double)(maxval + minval) * 0.5;
          }
          else {
            dVar16 = (double)(long)((double)minval / local_80 + 0.5) * local_80;
          }
          if (row < 1) {
            lVar7 = 1;
            if (1 < lVar13) {
              lVar7 = lVar13;
            }
            lVar13 = 0;
            do {
              dVar19 = ((double)fdata[lVar13] - dVar16) / local_80;
              idata[lVar13] = (int)(dVar19 + *(double *)(&DAT_0021cc50 + (ulong)(dVar19 < 0.0) * 8))
              ;
              lVar13 = lVar13 + 1;
            } while (lVar7 != lVar13);
          }
          else {
            lVar7 = 1;
            if (1 < lVar13) {
              lVar7 = lVar13;
            }
            lVar13 = 0;
            do {
              if (dither_method == 2) {
                iVar14 = -0x7ffffffe;
                if ((fdata[lVar13] != 0.0) || (NAN(fdata[lVar13]))) goto LAB_001f6bbb;
              }
              else {
LAB_001f6bbb:
                dVar19 = (double)pfVar4[iVar6] + ((double)fdata[lVar13] - dVar16) / local_80 + -0.5;
                iVar14 = (int)(dVar19 + *(double *)(&DAT_0021cc50 + (ulong)(dVar19 < 0.0) * 8));
              }
              idata[lVar13] = iVar14;
              iVar6 = iVar6 + 1;
              if (iVar6 == 10000) {
                uVar3 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar3;
                if (uVar3 == 10000) {
                  uVar15 = 0;
                }
                iVar6 = (int)(pfVar4[(int)uVar15] * 500.0);
              }
              lVar13 = lVar13 + 1;
            } while (lVar7 != lVar13);
          }
        }
        else {
          dVar16 = local_80 * 2147483637.0 + (double)minval;
          if (row < 1) {
            lVar7 = 1;
            if (1 < lVar13) {
              lVar7 = lVar13;
            }
            lVar13 = 0;
            do {
              fVar18 = fdata[lVar13];
              if ((fVar18 != local_84) || (NAN(fVar18) || NAN(local_84))) {
                dVar19 = ((double)fVar18 - dVar16) / local_80;
                iVar6 = (int)(dVar19 + *(double *)(&DAT_0021cc50 + (ulong)(dVar19 < 0.0) * 8));
              }
              else {
                iVar6 = -0x7fffffff;
              }
              idata[lVar13] = iVar6;
              lVar13 = lVar13 + 1;
            } while (lVar7 != lVar13);
          }
          else {
            lVar7 = 1;
            if (1 < lVar13) {
              lVar7 = lVar13;
            }
            lVar13 = 0;
            do {
              fVar18 = fdata[lVar13];
              if ((fVar18 != local_84) || (NAN(fVar18) || NAN(local_84))) {
                if (dither_method == 2) {
                  iVar14 = -0x7ffffffe;
                  if ((fVar18 == 0.0) && (!NAN(fVar18))) goto LAB_001f6a2b;
                }
                dVar19 = (double)pfVar4[iVar6] + ((double)fVar18 - dVar16) / local_80 + -0.5;
                iVar14 = (int)(dVar19 + *(double *)(&DAT_0021cc50 + (ulong)(dVar19 < 0.0) * 8));
              }
              else {
                iVar14 = -0x7fffffff;
              }
LAB_001f6a2b:
              idata[lVar13] = iVar14;
              iVar6 = iVar6 + 1;
              if (iVar6 == 10000) {
                uVar3 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar3;
                if (uVar3 == 10000) {
                  uVar15 = 0;
                }
                iVar6 = (int)(pfVar4[(int)uVar15] * 500.0);
              }
              lVar13 = lVar13 + 1;
            } while (lVar7 != lVar13);
          }
        }
        dVar19 = ((double)minval - dVar16) / local_80;
        uVar15 = -(ulong)(dVar19 < 0.0);
        *iminval = (int)((double)(~uVar15 & 0x3fe0000000000000 |
                                 (ulong)((uint)(uVar15 >> 0x20) & 0xbfe00000) << 0x20) + dVar19);
        dVar19 = ((double)maxval - dVar16) / local_80;
        uVar15 = -(ulong)(dVar19 < 0.0);
        *imaxval = (int)((double)(~uVar15 & 0x3fe0000000000000 |
                                 (ulong)((uint)(uVar15 >> 0x20) & 0xbfe00000) << 0x20) + dVar19);
        iVar6 = 1;
        goto LAB_001f6cf2;
      }
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int fits_quantize_float (long row, float fdata[], long nxpix, long nypix, int nullcheck, 
	float in_null_value, float qlevel, int dither_method, int idata[], double *bscale,
	double *bzero, int *iminval, int *imaxval) {

/* arguments:
long row            i: if positive, used to calculate random dithering seed value
                       (this is only used when dithering the quantized values)
float fdata[]       i: array of image pixels to be compressed
long nxpix          i: number of pixels in each row of fdata
long nypix          i: number of rows in fdata
nullcheck           i: check for nullvalues in fdata?
float in_null_value i: value used to represent undefined pixels in fdata
float qlevel        i: quantization level
int dither_method   i; which dithering method to use
int idata[]         o: values of fdata after applying bzero and bscale
double bscale       o: scale factor
double bzero        o: zero offset
int iminval         o: minimum quantized value that is returned
int imaxval         o: maximum quantized value that is returned

The function value will be one if the input fdata were copied to idata;
in this case the parameters bscale and bzero can be used to convert back to
nearly the original floating point values:  fdata ~= idata * bscale + bzero.
If the function value is zero, the data were not copied to idata.
*/

	int status, iseed = 0;
	long i, nx, ngood = 0;
	double stdev, noise2, noise3, noise5;	/* MAD 2nd, 3rd, and 5th order noise values */
	float minval = 0., maxval = 0.;  /* min & max of fdata */
	double delta;		/* bscale, 1 in idata = delta in fdata */
	double zeropt;	        /* bzero */
	double temp;
        int nextrand = 0;
	extern float *fits_rand_value; /* this is defined in imcompress.c */
	LONGLONG iqfactor;

	nx = nxpix * nypix;
	if (nx <= 1) {
	    *bscale = 1.;
	    *bzero  = 0.;
	    return (0);
	}

        if (qlevel >= 0.) {

	    /* estimate background noise using MAD pixel differences */
	    FnNoise5_float(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, &noise2, &noise3, &noise5, &status);      

	    if (nullcheck && ngood == 0) {   /* special case of an image filled with Nulls */
	        /* set parameters to dummy values, which are not used */
		minval = 0.;
		maxval = 1.;
		stdev = 1;
	    } else {

	        /* use the minimum of noise2, noise3, and noise5 as the best noise value */
	        stdev = noise3;
	        if (noise2 != 0. && noise2 < stdev) stdev = noise2;
	        if (noise5 != 0. && noise5 < stdev) stdev = noise5;
            }

	    if (qlevel == 0.)
	        delta = stdev / 4.;  /* default quantization */
	    else
	        delta = stdev / qlevel;

	    if (delta == 0.) 
	        return (0);			/* don't quantize */

	} else {
	    /* negative value represents the absolute quantization level */
	    delta = -qlevel;

	    /* only nned to calculate the min and max values */
	    FnNoise3_float(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, 0, &status);      
 	}

        /* check that the range of quantized levels is not > range of int */
	if ((maxval - minval) / delta > 2. * 2147483647. - N_RESERVED_VALUES )
	    return (0);			/* don't quantize */

        if (row > 0) { /* we need to dither the quantized values */
            if (!fits_rand_value) 
	        if (fits_init_randoms()) return(MEMORY_ALLOCATION);

	    /* initialize the index to the next random number in the list */
            iseed = (int) ((row - 1) % N_RANDOM);
	    nextrand = (int) (fits_rand_value[iseed] * 500.);
	}

        if (ngood == nx) {   /* don't have to check for nulls */
            /* return all positive values, if possible since some */
            /* compression algorithms either only work for positive integers, */
            /* or are more efficient.  */

            if (dither_method == SUBTRACTIVE_DITHER_2)
	    {
                /* shift the range to be close to the value used to represent zeros */
                zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);
            }
	    else if ((maxval - minval) / delta < 2147483647. - N_RESERVED_VALUES )
            {
                zeropt = minval;
		/* fudge the zero point so it is an integer multiple of delta */
		/* This helps to ensure the same scaling will be performed if the */
		/* file undergoes multiple fpack/funpack cycles */
		iqfactor = (LONGLONG) (zeropt/delta  + 0.5);
		zeropt = iqfactor * delta;               
            }
            else
            {
                /* center the quantized levels around zero */
                zeropt = (minval + maxval) / 2.;
            }

            if (row > 0) {  /* dither the values when quantizing */
              for (i = 0;  i < nx;  i++) {
	    
		if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		   idata[i] = ZERO_VALUE;
		} else {
		   idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		}

                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */

       	        for (i = 0;  i < nx;  i++) {
	            idata[i] = NINT ((fdata[i] - zeropt) / delta);
                }
            } 
        }
        else {
            /* data contains null values; shift the range to be */
            /* close to the value used to represent null values */
            zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);

            if (row > 0) {  /* dither the values */
	      for (i = 0;  i < nx;  i++) {
                if (fdata[i] != in_null_value) {
		    if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		       idata[i] = ZERO_VALUE;
		    } else {
		       idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		    }
                } else {
                    idata[i] = NULL_VALUE;
                }

                /* increment the random number index, regardless */
                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */
	       for (i = 0;  i < nx;  i++) {
 
                 if (fdata[i] != in_null_value) {
		    idata[i] =  NINT((fdata[i] - zeropt) / delta);
                 } else { 
                    idata[i] = NULL_VALUE;
                 }
               }
            }
	}

        /* calc min and max values */
        temp = (minval - zeropt) / delta;
        *iminval =  NINT (temp);
        temp = (maxval - zeropt) / delta;
        *imaxval =  NINT (temp);

	*bscale = delta;
	*bzero = zeropt;
	return (1);			/* yes, data have been quantized */
}